

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_removearchive(char *args)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *local_10;
  char *args_local;
  
  local_10 = args;
  if (*args == '\"') {
    local_10 = args + 1;
    sVar2 = strlen(local_10);
    local_10[sVar2 - 1] = '\0';
  }
  iVar1 = PHYSFS_unmount(local_10);
  if (iVar1 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    printf("Successful.\n");
  }
  return 1;
}

Assistant:

static int cmd_removearchive(char *args)
{
    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    if (PHYSFS_unmount(args))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}